

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O2

void __thiscall
gui::DialogBox::setCancelButton(DialogBox *this,size_t index,shared_ptr<gui::Button> *button)

{
  __shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>);
  setOptionButton(this,index,(shared_ptr<gui::Button> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  this->cancelIndex_ =
       -(ulong)((button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
               (element_type *)0x0) | index;
  return;
}

Assistant:

void DialogBox::setCancelButton(size_t index, std::shared_ptr<Button> button) {
    setOptionButton(index, button);
    cancelIndex_ = (button != nullptr ? index : std::numeric_limits<size_t>::max());
}